

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derDecDeep(octet *der,size_t count,size_t deep)

{
  bool_t bVar1;
  size_t sVar2;
  size_t *in_RDX;
  u32 *in_RSI;
  size_t *in_RDI;
  size_t c1;
  size_t c;
  size_t len;
  u32 tag;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  char *in_stack_fffffffffffffff8;
  size_t len_00;
  
  if (in_RDX < (size_t *)0x21) {
    len_00 = derTLDec(in_RSI,in_RDX,
                      (octet *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (size_t)in_stack_ffffffffffffffd0);
    if ((len_00 == 0xffffffffffffffff) ||
       (in_RSI < (u32 *)(len_00 + (long)in_stack_ffffffffffffffd0))) {
      len_00 = 0xffffffffffffffff;
    }
    else {
      bVar1 = derTIsPrimitive(in_stack_ffffffffffffffdc);
      if (bVar1 == 0) {
        for (; in_stack_ffffffffffffffd0 != (void *)0x0;
            in_stack_ffffffffffffffd0 = (void *)((long)in_stack_ffffffffffffffd0 - sVar2)) {
          sVar2 = derDecDeep((octet *)in_RSI,(size_t)in_RDX,
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          if (sVar2 == 0xffffffffffffffff) {
            return 0xffffffffffffffff;
          }
          len_00 = sVar2 + len_00;
        }
      }
      else if (in_stack_ffffffffffffffdc == 3) {
        len_00 = derTBITDec((octet *)in_RSI,in_RDX,(octet *)CONCAT44(3,in_stack_ffffffffffffffd8),
                            (size_t)in_stack_ffffffffffffffd0,(u32)(len_00 >> 0x20));
      }
      else if (in_stack_ffffffffffffffdc == 5) {
        len_00 = derDec4((octet *)in_RSI,(size_t)in_RDX,5,in_stack_ffffffffffffffd0,len_00);
      }
      else if (in_stack_ffffffffffffffdc == 6) {
        len_00 = derOIDDec(in_stack_fffffffffffffff8,in_RDI,(octet *)in_RSI,(size_t)in_RDX);
      }
      else if (in_stack_ffffffffffffffdc == 0x13) {
        len_00 = derTPSTRDec(in_stack_fffffffffffffff8,in_RDI,(octet *)in_RSI,(size_t)in_RDX,0x13);
      }
      else {
        len_00 = len_00 + (long)in_stack_ffffffffffffffd0;
      }
    }
  }
  else {
    len_00 = 0xffffffffffffffff;
  }
  return len_00;
}

Assistant:

static size_t derDecDeep(const octet der[], size_t count, size_t deep)
{
	u32 tag;
	size_t len;
	size_t c;
	// превышена глубина вложенности?
	if (deep > 32)
		return SIZE_MAX;
	// обработать TL
	c = derTLDec(&tag, &len, der, count);
	if (c == SIZE_MAX || c + len > count)
		return SIZE_MAX;
	// примитивный код?
	if (derTIsPrimitive(tag))
	{
		if (tag == 0x03)
			return derBITDec(0, &len, der, count);
		if (tag == 0x05)
			return derNULLDec(der, count);
		if (tag == 0x06)
			return derOIDDec(0, &len, der, count);
		if (tag == 0x13)
			return derPSTRDec(0, &len, der, count);
		return c + len;
	}
	// конструктивный код
	while (len)
	{
		size_t c1;
		c1 = derDecDeep(der + c, len, deep + 1);
		if (c1 == SIZE_MAX)
			return SIZE_MAX;
		c += c1, len -= c1;
	}
	return c;
}